

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O2

bool EV_DoDonut(int tag,line_t_conflict *line,double pillarspeed,double slimespeed)

{
  sector_t_conflict *this;
  double dVar1;
  bool bVar2;
  ushort uVar3;
  uint uVar4;
  sector_t_conflict *sec;
  DFloor *pDVar5;
  ulong uVar6;
  sector_t_conflict *sec_00;
  bool bVar7;
  vertex_t *spot;
  FSectorTagIterator itr;
  vertex_t *local_50;
  double local_48;
  double local_40;
  FSectorTagIterator local_38;
  
  local_48 = pillarspeed;
  local_40 = slimespeed;
  FSectorTagIterator::FSectorTagIterator(&local_38,tag,line);
  bVar7 = false;
  do {
    do {
      do {
        do {
          uVar4 = FSectorTagIterator::Next(&local_38);
          if ((int)uVar4 < 0) {
            return bVar7;
          }
          sec_00 = sectors + uVar4;
          bVar2 = sector_t::PlaneMoving((sector_t *)sec_00,0);
        } while (bVar2);
        sec = getNextSector(*sec_00->lines,sec_00);
        bVar7 = true;
      } while (sec == (sector_t_conflict *)0x0);
      bVar2 = sector_t::PlaneMoving((sector_t *)sec,0);
    } while (bVar2);
    uVar3 = (ushort)*(undefined4 *)&sec->linecount;
    if ((short)uVar3 < 1) {
      uVar3 = 0;
    }
    for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
      if (((sec->lines[uVar6]->flags & 4) != 0) &&
         (this = sec->lines[uVar6]->backsector, this != sec_00)) {
        pDVar5 = (DFloor *)DObject::operator_new(0xa0);
        DFloor::DFloor(pDVar5,sec);
        pDVar5->m_Type = donutRaise;
        pDVar5->m_Crush = -1;
        pDVar5->m_Hexencrush = false;
        pDVar5->m_Direction = 1;
        (pDVar5->super_DMovingFloor).super_DMover.super_DSectorEffect.m_Sector = sec;
        pDVar5->m_Speed = local_40;
        (pDVar5->m_Texture).texnum = this->planes[0].Texture.texnum;
        (pDVar5->m_NewSpecial).damagetype = (FName)0x0;
        (pDVar5->m_NewSpecial).damageamount = 0;
        (pDVar5->m_NewSpecial).special = 0;
        (pDVar5->m_NewSpecial).damageinterval = 0;
        (pDVar5->m_NewSpecial).leakydamage = 0;
        *(undefined2 *)&(pDVar5->m_NewSpecial).field_0xe = 0;
        (pDVar5->m_NewSpecial).Flags = 0;
        dVar1 = sector_t::FindHighestFloorPoint((sector_t *)this,&local_50);
        dVar1 = secplane_t::PointToDist(&sec->floorplane,local_50,dVar1);
        pDVar5->m_FloorDestDist = dVar1;
        DFloor::StartFloorSound(pDVar5);
        pDVar5 = (DFloor *)DObject::operator_new(0xa0);
        DFloor::DFloor(pDVar5,sec_00);
        pDVar5->m_Type = floorLowerToNearest;
        pDVar5->m_Crush = -1;
        pDVar5->m_Hexencrush = false;
        pDVar5->m_Direction = -1;
        (pDVar5->super_DMovingFloor).super_DMover.super_DSectorEffect.m_Sector = sec_00;
        pDVar5->m_Speed = local_48;
        dVar1 = sector_t::FindHighestFloorPoint((sector_t *)this,&local_50);
        dVar1 = secplane_t::PointToDist(&sec_00->floorplane,local_50,dVar1);
        pDVar5->m_FloorDestDist = dVar1;
        DFloor::StartFloorSound(pDVar5);
        break;
      }
    }
  } while( true );
}

Assistant:

bool EV_DoDonut (int tag, line_t *line, double pillarspeed, double slimespeed)
{
	sector_t*			s1;
	sector_t*			s2;
	sector_t*			s3;
	int 				secnum;
	bool 				rtn;
	int 				i;
	DFloor*				floor;
	vertex_t*			spot;
	double				height;
		
	rtn = false;

	FSectorTagIterator itr(tag, line);
	while ((secnum = itr.Next()) >= 0)
	{
		s1 = &sectors[secnum];					// s1 is pillar's sector

		// ALREADY MOVING?	IF SO, KEEP GOING...
		if (s1->PlaneMoving(sector_t::floor))
			continue; // safe now, because we check that tag is non-0 in the looping condition [fdari]
						
		rtn = true;
		s2 = getNextSector (s1->lines[0], s1);	// s2 is pool's sector
		if (!s2)								// note lowest numbered line around
			continue;							// pillar must be two-sided

		if (s2->PlaneMoving(sector_t::floor))
			continue;

		for (i = 0; i < s2->linecount; i++)
		{
			if (!(s2->lines[i]->flags & ML_TWOSIDED) ||
				(s2->lines[i]->backsector == s1))
				continue;
			s3 = s2->lines[i]->backsector;
			
			//	Spawn rising slime
			floor = new DFloor (s2);
			floor->m_Type = DFloor::donutRaise;
			floor->m_Crush = -1;
			floor->m_Hexencrush = false;
			floor->m_Direction = 1;
			floor->m_Sector = s2;
			floor->m_Speed = slimespeed;
			floor->m_Texture = s3->GetTexture(sector_t::floor);
			floor->m_NewSpecial.Clear();
			height = s3->FindHighestFloorPoint (&spot);
			floor->m_FloorDestDist = s2->floorplane.PointToDist (spot, height);
			floor->StartFloorSound ();
			
			//	Spawn lowering donut-hole
			floor = new DFloor (s1);
			floor->m_Type = DFloor::floorLowerToNearest;
			floor->m_Crush = -1;
			floor->m_Hexencrush = false;
			floor->m_Direction = -1;
			floor->m_Sector = s1;
			floor->m_Speed = pillarspeed;
			height = s3->FindHighestFloorPoint (&spot);
			floor->m_FloorDestDist = s1->floorplane.PointToDist (spot, height);
			floor->StartFloorSound ();
			break;
		}
	}
	return rtn;
}